

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void __thiscall amrex::FABio_ascii::skip(FABio_ascii *this,istream *is,FArrayBox *f)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  IntVect IStack_58;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  IntVect IStack_3c;
  
  iStack_48 = (f->super_BaseFab<double>).domain.bigend.vect[0];
  iStack_44 = (f->super_BaseFab<double>).domain.bigend.vect[1];
  iStack_40 = (f->super_BaseFab<double>).domain.bigend.vect[2];
  IStack_3c.vect[0] = 0;
  IStack_3c.vect[1] = 0;
  IStack_3c.vect[2] = 0;
  IStack_58.vect._0_8_ = *(undefined8 *)(f->super_BaseFab<double>).domain.smallend.vect;
  IStack_58.vect[2] = (f->super_BaseFab<double>).domain.smallend.vect[2];
  while ((IStack_58.vect[2] <= iStack_40 &&
         ((iStack_40 != IStack_58.vect[2] ||
          ((IStack_58.vect[1] <= iStack_44 &&
           ((iStack_44 != IStack_58.vect[1] || (IStack_58.vect[0] <= iStack_48))))))))) {
    amrex::operator>>(is,&IStack_3c);
    if (((IStack_58.vect[0] != IStack_3c.vect[0]) || (IStack_58.vect[1] != IStack_3c.vect[1])) ||
       (IStack_58.vect[2] != IStack_3c.vect[2])) {
      poVar3 = ErrorStream();
      poVar3 = std::operator<<(poVar3,"Error: read IntVect ");
      poVar3 = amrex::operator<<(poVar3,&IStack_3c);
      poVar3 = std::operator<<(poVar3,"  should be ");
      poVar3 = amrex::operator<<(poVar3,&IStack_58);
      std::operator<<(poVar3,'\n');
      Error_host("FABio_ascii::read() bad IntVect");
    }
    for (lVar4 = 0; lVar4 < (f->super_BaseFab<double>).nvar; lVar4 = lVar4 + 1) {
      Box::numPts(&(f->super_BaseFab<double>).domain);
      std::istream::_M_extract<double>((double *)is);
    }
    iVar1 = IStack_58.vect[0];
    iVar2 = IStack_58.vect[1];
    IStack_58.vect[0] = IStack_58.vect[0] + 1;
    if ((f->super_BaseFab<double>).domain.bigend.vect[0] <= iVar1) {
      IStack_58.vect[0] = (f->super_BaseFab<double>).domain.smallend.vect[0];
      IStack_58.vect[1] = IStack_58.vect[1] + 1;
      if ((f->super_BaseFab<double>).domain.bigend.vect[1] <= iVar2) {
        IStack_58.vect[1] = (f->super_BaseFab<double>).domain.smallend.vect[1];
        IStack_58.vect[2] = IStack_58.vect[2] + 1;
      }
    }
  }
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("FABio_ascii::read() failed");
  }
  return;
}

Assistant:

void
FABio_ascii::skip (std::istream& is,
                   FArrayBox&    f) const
{
#ifdef AMREX_USE_GPU
    if (f.arena()->isManaged() || f.arena()->isDevice()) {
        FArrayBox hostfab(f.box(), f.nComp(), The_Pinned_Arena());
        FABio_ascii::read(is, hostfab);
        Gpu::htod_memcpy_async(f.dataPtr(), hostfab.dataPtr(), f.size()*sizeof(Real));
        Gpu::streamSynchronize();
    } else
#endif
    {
        FABio_ascii::read(is, f);
    }
}